

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<VkSpecParser::Command>::emplace<VkSpecParser::Command_const&>
          (QGenericArrayOps<VkSpecParser::Command> *this,qsizetype i,Command *args)

{
  qsizetype *pqVar1;
  Command **ppCVar2;
  Data *pDVar3;
  long lVar4;
  Command *pCVar5;
  Data *pDVar6;
  Data *pDVar7;
  char16_t *pcVar8;
  qsizetype qVar9;
  Data *pDVar10;
  char16_t *pcVar11;
  qsizetype qVar12;
  Data *pDVar13;
  char16_t *pcVar14;
  qsizetype qVar15;
  TypedName *pTVar16;
  qsizetype qVar17;
  long in_FS_OFFSET;
  bool bVar18;
  Command tmp;
  Inserter local_e8;
  Command local_98;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QArrayDataPointer<VkSpecParser::Command>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_00107e6a:
    local_98.cmd.name.d.d = (args->cmd).name.d.d;
    local_98.cmd.name.d.ptr = (args->cmd).name.d.ptr;
    local_98.cmd.name.d.size = (args->cmd).name.d.size;
    if (&(local_98.cmd.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_98.cmd.name.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_98.cmd.name.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_98.cmd.type.d.d = (args->cmd).type.d.d;
    local_98.cmd.type.d.ptr = (args->cmd).type.d.ptr;
    local_98.cmd.type.d.size = (args->cmd).type.d.size;
    if (&(local_98.cmd.type.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_98.cmd.type.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_98.cmd.type.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_98.cmd.typeSuffix.d.d = (args->cmd).typeSuffix.d.d;
    local_98.cmd.typeSuffix.d.ptr = (args->cmd).typeSuffix.d.ptr;
    local_98.cmd.typeSuffix.d.size = (args->cmd).typeSuffix.d.size;
    if (&(local_98.cmd.typeSuffix.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_98.cmd.typeSuffix.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_98.cmd.typeSuffix.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_98.args.d.d = (args->args).d.d;
    local_98.args.d.ptr = (args->args).d.ptr;
    local_98.args.d.size = (args->args).d.size;
    if (local_98.args.d.d != (Data *)0x0) {
      LOCK();
      ((local_98.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_98._97_7_ = 0xaaaaaaaaaaaaaa;
    local_98.deviceLevel = args->deviceLevel;
    bVar18 = (this->super_QArrayDataPointer<VkSpecParser::Command>).size != 0;
    QArrayDataPointer<VkSpecParser::Command>::detachAndGrow
              (&this->super_QArrayDataPointer<VkSpecParser::Command>,(uint)(i == 0 && bVar18),1,
               (Command **)0x0,(QArrayDataPointer<VkSpecParser::Command> *)0x0);
    qVar17 = local_98.args.d.size;
    pTVar16 = local_98.args.d.ptr;
    pDVar7 = local_98.args.d.d;
    qVar15 = local_98.cmd.typeSuffix.d.size;
    pcVar14 = local_98.cmd.typeSuffix.d.ptr;
    pDVar13 = local_98.cmd.typeSuffix.d.d;
    qVar12 = local_98.cmd.type.d.size;
    pcVar11 = local_98.cmd.type.d.ptr;
    pDVar10 = local_98.cmd.type.d.d;
    qVar9 = local_98.cmd.name.d.size;
    pcVar8 = local_98.cmd.name.d.ptr;
    pDVar6 = local_98.cmd.name.d.d;
    if (i == 0 && bVar18) {
      pCVar5 = (this->super_QArrayDataPointer<VkSpecParser::Command>).ptr;
      local_98.cmd.name.d.d = (Data *)0x0;
      pCVar5[-1].cmd.name.d.d = pDVar6;
      local_98.cmd.name.d.ptr = (char16_t *)0x0;
      pCVar5[-1].cmd.name.d.ptr = pcVar8;
      local_98.cmd.name.d.size = 0;
      pCVar5[-1].cmd.name.d.size = qVar9;
      local_98.cmd.type.d.d = (Data *)0x0;
      pCVar5[-1].cmd.type.d.d = pDVar10;
      local_98.cmd.type.d.ptr = (char16_t *)0x0;
      pCVar5[-1].cmd.type.d.ptr = pcVar11;
      local_98.cmd.type.d.size = 0;
      pCVar5[-1].cmd.type.d.size = qVar12;
      local_98.cmd.typeSuffix.d.d = (Data *)0x0;
      pCVar5[-1].cmd.typeSuffix.d.d = pDVar13;
      local_98.cmd.typeSuffix.d.ptr = (char16_t *)0x0;
      pCVar5[-1].cmd.typeSuffix.d.ptr = pcVar14;
      local_98.cmd.typeSuffix.d.size = 0;
      pCVar5[-1].cmd.typeSuffix.d.size = qVar15;
      local_98.args.d.d = (Data *)0x0;
      pCVar5[-1].args.d.d = pDVar7;
      local_98.args.d.ptr = (TypedName *)0x0;
      pCVar5[-1].args.d.ptr = pTVar16;
      local_98.args.d.size = 0;
      pCVar5[-1].args.d.size = qVar17;
      pCVar5[-1].deviceLevel = local_98.deviceLevel;
      (this->super_QArrayDataPointer<VkSpecParser::Command>).ptr = pCVar5 + -1;
      pqVar1 = &(this->super_QArrayDataPointer<VkSpecParser::Command>).size;
      *pqVar1 = *pqVar1 + 1;
    }
    else {
      local_e8.sourceCopyConstruct = 0;
      local_e8.nSource = 0;
      local_e8.move = 0;
      local_e8.sourceCopyAssign = 0;
      local_e8.end = (Command *)0x0;
      local_e8.last = (Command *)0x0;
      local_e8.where = (Command *)0x0;
      local_e8.begin = (this->super_QArrayDataPointer<VkSpecParser::Command>).ptr;
      local_e8.size = (this->super_QArrayDataPointer<VkSpecParser::Command>).size;
      local_e8.data = &this->super_QArrayDataPointer<VkSpecParser::Command>;
      Inserter::insertOne(&local_e8,i,&local_98);
      (local_e8.data)->ptr = local_e8.begin;
      (local_e8.data)->size = local_e8.size;
    }
    QArrayDataPointer<VkSpecParser::TypedName>::~QArrayDataPointer(&local_98.args.d);
    if (&(local_98.cmd.typeSuffix.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.cmd.typeSuffix.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           = ((local_98.cmd.typeSuffix.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.cmd.typeSuffix.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        QArrayData::deallocate(&(local_98.cmd.typeSuffix.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_98.cmd.type.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.cmd.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.cmd.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_98.cmd.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_98.cmd.type.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_98.cmd.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.cmd.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.cmd.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_98.cmd.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_98.cmd.name.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    lVar4 = (this->super_QArrayDataPointer<VkSpecParser::Command>).size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QArrayDataPointer<VkSpecParser::Command>).ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        0x4ec4ec4ec4ec4ec5)) {
      pCVar5 = (this->super_QArrayDataPointer<VkSpecParser::Command>).ptr;
      pDVar6 = (args->cmd).name.d.d;
      pCVar5[lVar4].cmd.name.d.d = pDVar6;
      pCVar5[lVar4].cmd.name.d.ptr = (args->cmd).name.d.ptr;
      pCVar5[lVar4].cmd.name.d.size = (args->cmd).name.d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value =
             (Type)((int)(pDVar6->super_QArrayData).ref_._q_value + 1);
        UNLOCK();
      }
      pDVar6 = (args->cmd).type.d.d;
      pCVar5[lVar4].cmd.type.d.d = pDVar6;
      pCVar5[lVar4].cmd.type.d.ptr = (args->cmd).type.d.ptr;
      pCVar5[lVar4].cmd.type.d.size = (args->cmd).type.d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar6 = (args->cmd).typeSuffix.d.d;
      pCVar5[lVar4].cmd.typeSuffix.d.d = pDVar6;
      pCVar5[lVar4].cmd.typeSuffix.d.ptr = (args->cmd).typeSuffix.d.ptr;
      pCVar5[lVar4].cmd.typeSuffix.d.size = (args->cmd).typeSuffix.d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar7 = (args->args).d.d;
      pCVar5[lVar4].args.d.d = pDVar7;
      pCVar5[lVar4].args.d.ptr = (args->args).d.ptr;
      pCVar5[lVar4].args.d.size = (args->args).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pCVar5[lVar4].deviceLevel = args->deviceLevel;
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((Command *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QArrayDataPointer<VkSpecParser::Command>).ptr)) goto LAB_00107e6a;
      pCVar5 = (this->super_QArrayDataPointer<VkSpecParser::Command>).ptr;
      pDVar6 = (args->cmd).name.d.d;
      pCVar5[-1].cmd.name.d.d = pDVar6;
      pCVar5[-1].cmd.name.d.ptr = (args->cmd).name.d.ptr;
      pCVar5[-1].cmd.name.d.size = (args->cmd).name.d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value =
             (Type)((int)(pDVar6->super_QArrayData).ref_._q_value + 1);
        UNLOCK();
      }
      pDVar6 = (args->cmd).type.d.d;
      pCVar5[-1].cmd.type.d.d = pDVar6;
      pCVar5[-1].cmd.type.d.ptr = (args->cmd).type.d.ptr;
      pCVar5[-1].cmd.type.d.size = (args->cmd).type.d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar6 = (args->cmd).typeSuffix.d.d;
      pCVar5[-1].cmd.typeSuffix.d.d = pDVar6;
      pCVar5[-1].cmd.typeSuffix.d.ptr = (args->cmd).typeSuffix.d.ptr;
      pCVar5[-1].cmd.typeSuffix.d.size = (args->cmd).typeSuffix.d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar7 = (args->args).d.d;
      pCVar5[-1].args.d.d = pDVar7;
      pCVar5[-1].args.d.ptr = (args->args).d.ptr;
      pCVar5[-1].args.d.size = (args->args).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pCVar5[-1].deviceLevel = args->deviceLevel;
      ppCVar2 = &(this->super_QArrayDataPointer<VkSpecParser::Command>).ptr;
      *ppCVar2 = *ppCVar2 + -1;
    }
    pqVar1 = &(this->super_QArrayDataPointer<VkSpecParser::Command>).size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }